

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::CollapseSide(ON_NurbsSurface *this,int side,ON_3dPoint point)

{
  bool bVar1;
  bool bVar2;
  double *pdVar3;
  _func_int **pp_Var4;
  int i;
  int iVar5;
  int j;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double in_XMM1_Qa;
  double local_60;
  ON_4dPoint local_58;
  ulong local_38;
  
  bVar1 = ON_3dPoint::operator==(&point,&ON_3dPoint::UnsetPoint);
  if (!bVar1) {
    if (this->m_cv != (double *)0x0) goto LAB_0055a433;
    goto LAB_0055a507;
  }
  switch(side) {
  case 0:
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this);
    pdVar3 = ON_Interval::operator[]((ON_Interval *)&local_58,0);
    local_60 = *pdVar3;
    pp_Var4 = (this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object;
    break;
  case 1:
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,0);
    pdVar3 = ON_Interval::operator[]((ON_Interval *)&local_58,1);
    local_60 = *pdVar3;
    pp_Var4 = (this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object;
    break;
  case 2:
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,0);
    pdVar3 = ON_Interval::operator[]((ON_Interval *)&local_58,1);
    local_60 = *pdVar3;
    pp_Var4 = (this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object;
    goto LAB_0055a364;
  case 3:
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this);
    pdVar3 = ON_Interval::operator[]((ON_Interval *)&local_58,0);
    local_60 = *pdVar3;
    pp_Var4 = (this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object;
LAB_0055a364:
    (*pp_Var4[0x26])(this,1);
    local_58.x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    iVar5 = 1;
    local_58.y = in_XMM1_Qa;
    goto LAB_0055a3dd;
  default:
    local_58.z = ON_3dPoint::UnsetPoint.z;
    local_58.x = ON_3dPoint::UnsetPoint.x;
    local_58.y = ON_3dPoint::UnsetPoint.y;
    goto LAB_0055a3f9;
  }
  (*pp_Var4[0x26])(this);
  local_58.x = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  iVar5 = 0;
  local_58.y = in_XMM1_Qa;
LAB_0055a3dd:
  pdVar3 = ON_Interval::operator[]((ON_Interval *)&local_58,iVar5);
  ON_Surface::PointAt((ON_3dPoint *)&local_58,&this->super_ON_Surface,local_60,*pdVar3);
LAB_0055a3f9:
  point.z = local_58.z;
  point.x = local_58.x;
  point.y = local_58.y;
  bVar1 = ON_3dPoint::operator==(&point,&ON_3dPoint::UnsetPoint);
  if (bVar1) {
    return false;
  }
  if (this->m_cv == (double *)0x0) {
    return false;
  }
LAB_0055a433:
  if (3 < (uint)side) goto LAB_0055a507;
  local_38 = (ulong)(uint)this->m_cv_count[0];
  iVar5 = this->m_cv_count[1];
  switch(side) {
  case 0:
    iVar5 = 1;
    i = side;
    break;
  case 1:
    i = this->m_cv_count[0] - 1;
    goto LAB_0055a46d;
  case 2:
    side = iVar5 + -1;
    i = 0;
    break;
  case 3:
    local_38 = 1;
    i = 0;
LAB_0055a46d:
    side = 0;
  }
  if (side < iVar5 && i < (int)local_38) {
    for (; bVar1 = (int)local_38 <= i, j = side, i < (int)local_38; i = i + 1) {
      while (j < iVar5) {
        bVar2 = GetCV(this,i,j,&local_58);
        if (!bVar2) {
          return bVar1;
        }
        local_58.x = local_58.w * point.x;
        local_58.y = local_58.w * point.y;
        local_58.z = local_58.w * point.z;
        bVar2 = SetCV(this,i,j,&local_58);
        j = j + 1;
        if (!bVar2) {
          return bVar1;
        }
      }
    }
  }
  else {
LAB_0055a507:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::CollapseSide(
       int side,
       ON_3dPoint point
       )
{
  if ( point == ON_3dPoint::UnsetPoint )
  {
    point = CornerAt(*this,side);
    if ( point == ON_3dPoint::UnsetPoint )
      return false;
  }

  if ( !m_cv )
    return false;

  int i0 = 0;
  int i1 = m_cv_count[0];
  int j0 = 0;
  int j1 = m_cv_count[1];

  switch (side)
  {
  case 0: // south
    j1 = j0+1;
    break;
  case 1: // east
    i0 = i1-1;
    break;
  case 2: // north
    j0 = j1-1;
    break;
  case 3: // west
    i1 = i0+1;
    break;
  default:
    return false;
    break;
  }

  if ( i0 >= i1 || j0 >= j1 )
    return false;

  int i, j;
  ON_4dPoint cv;
  for ( i = i0; i < i1; i++ ) for ( j = j0; j < j1; j++ )
  {
    if ( !GetCV(i,j,cv) )
      return false;
    cv.x = point.x*cv.w;
    cv.y = point.y*cv.w;
    cv.z = point.z*cv.w;
    if ( !SetCV(i,j,cv) )
      return false;
  }
  return true;
}